

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O2

void __thiscall
CStructure::CopyMember(CStructure *this,CStructureEntry2 *item,aint newDefault,EType newDeltaType)

{
  aint aVar1;
  aint aVar2;
  EStructureMembers EVar3;
  CStructureEntry2 *n;
  
  n = (CStructureEntry2 *)operator_new(0x28);
  aVar1 = this->noffset;
  aVar2 = item->len;
  EVar3 = item->type;
  n->next = (CStructureEntry2 *)0x0;
  n->text = (byte *)0x0;
  n->offset = aVar1;
  n->len = aVar2;
  n->def = newDefault;
  n->defDeltaType = newDeltaType;
  n->type = EVar3;
  AddMember(this,n);
  return;
}

Assistant:

void CStructure::CopyMember(CStructureEntry2* item, aint newDefault, Relocation::EType newDeltaType) {
	AddMember(new CStructureEntry2(noffset, item->len, newDefault, newDeltaType, item->type));
}